

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

int luv_tty_get_winsize(lua_State *L)

{
  int iVar1;
  uv_tty_t *tty;
  int in_ESI;
  int height;
  int width;
  int local_10;
  int local_c;
  
  tty = luv_check_tty(L,in_ESI);
  iVar1 = uv_tty_get_winsize(tty,&local_c,&local_10);
  if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(long)local_c);
    lua_pushinteger(L,(long)local_10);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int luv_tty_get_winsize(lua_State* L) {
  uv_tty_t* handle = luv_check_tty(L, 1);
  int width, height;
  int ret = uv_tty_get_winsize(handle, &width, &height);
  if (ret < 0) return luv_error(L, ret);
  lua_pushinteger(L, width);
  lua_pushinteger(L, height);
  return 2;
}